

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_dss_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *pEVar1;
  LIBSSH2_SESSION *pLVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  EVP_MD_CTX *ctx;
  LIBSSH2_SESSION *local_58;
  EVP_PKEY *local_50;
  uchar hash [20];
  
  pEVar1 = (EVP_PKEY *)*abstract;
  iVar3 = _libssh2_sha1_init(&ctx);
  if (iVar3 == 0) {
    *signature = (uchar *)0x0;
    *signature_len = 0;
  }
  else {
    local_50 = pEVar1;
    puVar4 = (uchar *)_libssh2_calloc(session,0x28);
    *signature = puVar4;
    if (puVar4 != (uchar *)0x0) {
      uVar6 = (ulong)(uint)veccount;
      if (veccount < 1) {
        uVar6 = 0;
      }
      *signature_len = 0x28;
      uVar5 = 0;
      local_58 = session;
      do {
        if (uVar6 * 0x10 + 0x10 == uVar5 + 0x10) {
          iVar3 = _libssh2_sha1_final(&ctx,hash);
          pLVar2 = local_58;
          if (iVar3 == 0) {
            return -1;
          }
          iVar3 = _libssh2_dsa_sha1_sign(local_50,hash,0x14,*signature);
          if (iVar3 != 0) {
            (*pLVar2->free)(*signature,&pLVar2->abstract);
            return -1;
          }
          return 0;
        }
        iVar3 = _libssh2_sha1_update
                          (&ctx,*(void **)((long)&datavec->iov_base + uVar5),
                           *(size_t *)((long)&datavec->iov_len + uVar5));
        uVar5 = uVar5 + 0x10;
      } while (iVar3 != 0);
    }
  }
  return -1;
}

Assistant:

static int
hostkey_method_ssh_dss_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;
    int i;

    if(!libssh2_sha1_init(&ctx)) {
        *signature = NULL;
        *signature_len = 0;
        return -1;
    }

    *signature = LIBSSH2_CALLOC(session, 2 * SHA_DIGEST_LENGTH);
    if(!*signature) {
        return -1;
    }

    *signature_len = 2 * SHA_DIGEST_LENGTH;

    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha1_update(ctx,
                                datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha1_final(ctx, hash)) {
        return -1;
    }

    if(_libssh2_dsa_sha1_sign(dsactx, hash, SHA_DIGEST_LENGTH, *signature)) {
        LIBSSH2_FREE(session, *signature);
        return -1;
    }

    return 0;
}